

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O3

unique_ptr<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>_>
 __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0>::
NewBarrier(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BlockingStrategy,_0> *this,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents)

{
  long *plVar1;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_RDX;
  
  plVar1 = (long *)operator_new(0x30);
  *plVar1 = (long)&dependents[7].
                   super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  plVar1[1] = (long)&dependents[1].
                     super__Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)(plVar1 + 2),
             in_RDX);
  *(undefined1 *)(plVar1 + 5) = 0;
  *(long **)&this->ring_buffer_ = plVar1;
  return (__uniq_ptr_data<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>,_true,_true>
          )(__uniq_ptr_data<disruptor::SequenceBarrier<disruptor::BlockingStrategy>,_std::default_delete<disruptor::SequenceBarrier<disruptor::BlockingStrategy>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<SequenceBarrier<W> > NewBarrier(
      const std::vector<Sequence*>& dependents) {
    std::unique_ptr<SequenceBarrier<W> > sb(
        new SequenceBarrier<W>(wait_strategy_, cursor_, dependents));
    return sb;
  }